

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  char cVar3;
  uchar uVar4;
  undefined1 uVar5;
  short sVar6;
  ushort uVar7;
  undefined8 uVar8;
  long lVar9;
  short sVar10;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  stbi__uint32 sVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  stbi__uint32 sVar24;
  stbi__uint32 sVar25;
  int iVar26;
  int iVar27;
  stbi__jpeg *psVar28;
  char *pcVar29;
  long lVar30;
  uchar *puVar31;
  stbi_uc *psVar32;
  void *pvVar33;
  code *pcVar34;
  stbi__context *data_00;
  undefined8 *puVar35;
  stbi_uc *psVar36;
  stbi__uint16 *data_01;
  ulong uVar37;
  undefined8 *puVar38;
  undefined1 *puVar39;
  short sVar40;
  int id;
  uint uVar41;
  ulong uVar42;
  stbi__context *psVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  ulong uVar47;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar48;
  stbi__result_info *ri_00;
  stbi__jpeg *psVar49;
  int iVar50;
  uint uVar51;
  stbi_uc *pal_entry;
  ulong uVar52;
  stbi_uc *psVar53;
  uint uVar54;
  int iVar55;
  uint uVar56;
  byte *pbVar57;
  stbi_uc **ppsVar58;
  uint uVar59;
  uint uVar60;
  short *psVar61;
  stbi__uint16 *psVar62;
  long in_FS_OFFSET;
  bool bVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  stbi__uint16 *local_8980;
  uint local_8978;
  uint local_8960;
  stbi_uc *local_8940;
  uint local_88ec;
  stbi_uc *coutput [4];
  int local_88c8;
  int local_88b8;
  int local_88b4;
  int local_88b0;
  short data [64];
  
  psVar36 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar28 = (stbi__jpeg *)malloc(0x4888);
  psVar28->s = s;
  psVar28->idct_block_kernel = stbi__idct_simd;
  psVar28->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar28->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar19 = stbi__decode_jpeg_header(psVar28,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar28);
  if (iVar19 != 0) {
    psVar28 = (stbi__jpeg *)malloc(0x4888);
    psVar28->s = s;
    psVar28->idct_block_kernel = stbi__idct_simd;
    psVar28->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar28->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar30 = 0x46d8; lVar30 != 0x4858; lVar30 = lVar30 + 0x60) {
        psVar36 = psVar28->huff_dc[0].fast + lVar30 + -8;
        psVar36[0] = '\0';
        psVar36[1] = '\0';
        psVar36[2] = '\0';
        psVar36[3] = '\0';
        psVar36[4] = '\0';
        psVar36[5] = '\0';
        psVar36[6] = '\0';
        psVar36[7] = '\0';
        psVar36[8] = '\0';
        psVar36[9] = '\0';
        psVar36[10] = '\0';
        psVar36[0xb] = '\0';
        psVar36[0xc] = '\0';
        psVar36[0xd] = '\0';
        psVar36[0xe] = '\0';
        psVar36[0xf] = '\0';
      }
      psVar28->restart_interval = 0;
      iVar19 = stbi__decode_jpeg_header(psVar28,0);
      if (iVar19 != 0) {
        paVar1 = psVar28->img_comp;
        bVar12 = stbi__get_marker(psVar28);
LAB_0013b430:
        if (bVar12 == 0xda) {
          iVar19 = stbi__get16be(psVar28->s);
          bVar12 = stbi__get8(psVar28->s);
          uVar60 = (uint)bVar12;
          psVar28->scan_n = (uint)bVar12;
          if (((0xfb < (byte)(bVar12 - 5)) &&
              (psVar43 = psVar28->s, (int)(uint)bVar12 <= psVar43->img_n)) &&
             (iVar19 == (uint)bVar12 * 2 + 6)) {
            lVar30 = 0;
            while( true ) {
              bVar12 = stbi__get8(psVar43);
              if ((int)uVar60 <= lVar30) break;
              bVar13 = stbi__get8(psVar28->s);
              psVar43 = psVar28->s;
              uVar60 = psVar43->img_n;
              uVar37 = 0;
              if (0 < (int)uVar60) {
                uVar37 = (ulong)uVar60;
              }
              paVar48 = paVar1;
              for (uVar52 = 0; uVar37 != uVar52; uVar52 = uVar52 + 1) {
                if (paVar48->id == (uint)bVar12) {
                  uVar37 = uVar52 & 0xffffffff;
                  break;
                }
                paVar48 = paVar48 + 1;
              }
              if ((uint)uVar37 == uVar60) goto LAB_0013c04e;
              psVar28->img_comp[uVar37].hd = (uint)(bVar13 >> 4);
              if ((0x3f < bVar13) || (paVar1[uVar37].ha = bVar13 & 0xf, 3 < (bVar13 & 0xf)))
              goto LAB_0013c03e;
              psVar28->order[lVar30] = (uint)uVar37;
              lVar30 = lVar30 + 1;
              uVar60 = psVar28->scan_n;
            }
            psVar28->spec_start = (uint)bVar12;
            bVar12 = stbi__get8(psVar28->s);
            psVar28->spec_end = (uint)bVar12;
            bVar12 = stbi__get8(psVar28->s);
            psVar28->succ_high = (uint)(bVar12 >> 4);
            psVar28->succ_low = bVar12 & 0xf;
            iVar19 = psVar28->spec_start;
            if (psVar28->progressive == 0) {
              if (((iVar19 == 0) && (bVar12 < 0x10)) && ((bVar12 & 0xf) == 0)) {
                psVar28->spec_end = 0x3f;
                goto LAB_0013b631;
              }
            }
            else if (((iVar19 < 0x40) && (psVar28->spec_end < 0x40)) &&
                    ((iVar19 <= psVar28->spec_end && ((bVar12 < 0xe0 && ((bVar12 & 0xf) < 0xe))))))
            {
LAB_0013b631:
              stbi__jpeg_reset(psVar28);
              if (psVar28->progressive == 0) {
                if (psVar28->scan_n == 1) {
                  iVar19 = psVar28->order[0];
                  uVar60 = psVar28->img_comp[iVar19].x + 7 >> 3;
                  iVar27 = psVar28->img_comp[iVar19].y + 7 >> 3;
                  if ((int)uVar60 < 1) {
                    uVar60 = 0;
                  }
                  iVar50 = 0;
                  if (iVar27 < 1) {
                    iVar27 = 0;
                  }
                  for (iVar44 = 0; iVar44 != iVar27; iVar44 = iVar44 + 1) {
                    for (lVar30 = 0; (ulong)uVar60 * 8 != lVar30; lVar30 = lVar30 + 8) {
                      iVar45 = stbi__jpeg_decode_block
                                         (psVar28,data,
                                          (stbi__huffman *)psVar28->huff_dc[paVar1[iVar19].hd].fast,
                                          (stbi__huffman *)psVar28->huff_ac[paVar1[iVar19].ha].fast,
                                          psVar28->fast_ac[paVar1[iVar19].ha],iVar19,
                                          psVar28->dequant[paVar1[iVar19].tq]);
                      if (iVar45 == 0) {
                        bVar63 = false;
                        goto LAB_0013beb4;
                      }
                      (*psVar28->idct_block_kernel)
                                (paVar1[iVar19].data + lVar30 + iVar50 * paVar1[iVar19].w2,
                                 paVar1[iVar19].w2,data);
                      iVar45 = psVar28->todo;
                      psVar28->todo = iVar45 + -1;
                      if (iVar45 < 2) {
                        if (psVar28->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar28);
                        }
                        if ((psVar28->marker & 0xf8) != 0xd0) goto LAB_0013beb1;
                        stbi__jpeg_reset(psVar28);
                      }
                    }
                    iVar50 = iVar50 + 8;
                  }
                }
                else {
                  for (iVar19 = 0; iVar19 < psVar28->img_mcu_y; iVar19 = iVar19 + 1) {
                    for (iVar27 = 0; iVar27 < psVar28->img_mcu_x; iVar27 = iVar27 + 1) {
                      for (lVar30 = 0; lVar30 < psVar28->scan_n; lVar30 = lVar30 + 1) {
                        iVar50 = psVar28->order[lVar30];
                        for (iVar44 = 0; iVar44 < paVar1[iVar50].v; iVar44 = iVar44 + 1) {
                          for (iVar45 = 0; iVar21 = paVar1[iVar50].h, iVar45 < iVar21;
                              iVar45 = iVar45 + 1) {
                            iVar22 = paVar1[iVar50].v;
                            iVar23 = stbi__jpeg_decode_block
                                               (psVar28,data,
                                                (stbi__huffman *)
                                                psVar28->huff_dc[paVar1[iVar50].hd].fast,
                                                (stbi__huffman *)
                                                psVar28->huff_ac[paVar1[iVar50].ha].fast,
                                                psVar28->fast_ac[paVar1[iVar50].ha],iVar50,
                                                psVar28->dequant[paVar1[iVar50].tq]);
                            if (iVar23 == 0) {
                              bVar63 = false;
                              goto LAB_0013beb4;
                            }
                            (*psVar28->idct_block_kernel)
                                      (paVar1[iVar50].data +
                                       (long)((iVar21 * iVar27 + iVar45) * 8) +
                                       (long)((iVar22 * iVar19 + iVar44) * paVar1[iVar50].w2 * 8),
                                       paVar1[iVar50].w2,data);
                          }
                        }
                      }
                      iVar50 = psVar28->todo;
                      psVar28->todo = iVar50 + -1;
                      if (iVar50 < 2) {
                        if (psVar28->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar28);
                        }
                        if ((psVar28->marker & 0xf8) != 0xd0) goto LAB_0013beb1;
                        stbi__jpeg_reset(psVar28);
                      }
                    }
                  }
                }
LAB_0013beb1:
                bVar63 = true;
LAB_0013beb4:
                if (!bVar63) goto LAB_0013c04e;
              }
              else if (psVar28->scan_n == 1) {
                iVar19 = psVar28->order[0];
                iVar27 = psVar28->img_comp[iVar19].x + 7 >> 3;
                iVar50 = psVar28->img_comp[iVar19].y + 7 >> 3;
                iVar44 = 0;
                if (iVar27 < 1) {
                  iVar27 = 0;
                }
                if (iVar50 < 1) {
                  iVar50 = iVar44;
                }
                for (; iVar44 != iVar50; iVar44 = iVar44 + 1) {
                  for (iVar45 = 0; iVar45 != iVar27; iVar45 = iVar45 + 1) {
                    psVar61 = paVar1[iVar19].coeff +
                              (paVar1[iVar19].coeff_w * iVar44 + iVar45) * 0x40;
                    uVar37 = (ulong)psVar28->spec_start;
                    if (uVar37 == 0) {
                      iVar21 = stbi__jpeg_decode_block_prog_dc
                                         (psVar28,psVar61,
                                          (stbi__huffman *)psVar28->huff_dc[paVar1[iVar19].hd].fast,
                                          iVar19);
                      if (iVar21 == 0) goto LAB_0013c04e;
                    }
                    else {
                      iVar21 = paVar1[iVar19].ha;
                      psVar36 = psVar28->huff_ac[iVar21].fast;
                      iVar22 = psVar28->eob_run;
                      bVar12 = (byte)psVar28->succ_low;
                      if (psVar28->succ_high == 0) {
                        if (iVar22 == 0) {
                          do {
                            if (psVar28->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar28);
                            }
                            sVar40 = psVar28->fast_ac[iVar21][psVar28->code_buffer >> 0x17];
                            uVar60 = (uint)sVar40;
                            iVar22 = (int)uVar37;
                            if (sVar40 == 0) {
                              uVar60 = stbi__jpeg_huff_decode(psVar28,(stbi__huffman *)psVar36);
                              if ((int)uVar60 < 0) goto LAB_0013c03e;
                              uVar41 = uVar60 >> 4;
                              if ((uVar60 & 0xf) == 0) {
                                if (uVar60 < 0xf0) {
                                  iVar22 = 1 << ((byte)uVar41 & 0x1f);
                                  psVar28->eob_run = iVar22;
                                  if (0xf < uVar60) {
                                    iVar22 = stbi__jpeg_get_bits(psVar28,uVar41);
                                    iVar22 = iVar22 + psVar28->eob_run;
                                  }
                                  goto LAB_0013b7d5;
                                }
                                uVar37 = (ulong)(iVar22 + 0x10);
                              }
                              else {
                                lVar30 = (ulong)uVar41 + (long)iVar22;
                                uVar37 = (ulong)((int)lVar30 + 1);
                                bVar13 = ""[lVar30];
                                iVar22 = stbi__extend_receive(psVar28,uVar60 & 0xf);
                                psVar61[bVar13] = (short)(iVar22 << (bVar12 & 0x1f));
                              }
                            }
                            else {
                              lVar30 = (ulong)(uVar60 >> 4 & 0xf) + (long)iVar22;
                              psVar28->code_buffer = psVar28->code_buffer << (sbyte)(uVar60 & 0xf);
                              psVar28->code_bits = psVar28->code_bits - (uVar60 & 0xf);
                              uVar37 = (ulong)((int)lVar30 + 1);
                              psVar61[""[lVar30]] = (short)((uVar60 >> 8) << (bVar12 & 0x1f));
                            }
                          } while ((int)uVar37 <= psVar28->spec_end);
                        }
                        else {
LAB_0013b7d5:
                          psVar28->eob_run = iVar22 + -1;
                        }
                      }
                      else if (iVar22 == 0) {
                        iVar21 = 0x10000 << (bVar12 & 0x1f);
                        do {
                          uVar60 = stbi__jpeg_huff_decode(psVar28,(stbi__huffman *)psVar36);
                          if ((int)uVar60 < 0) goto LAB_0013c03e;
                          uVar41 = uVar60 >> 4;
                          if ((uVar60 & 0xf) == 1) {
                            iVar22 = stbi__jpeg_get_bit(psVar28);
                            iVar23 = 1;
                            if (iVar22 == 0) {
                              iVar23 = 0xffff;
                            }
                            sVar40 = (short)(iVar23 << (bVar12 & 0x1f));
                          }
                          else {
                            if ((uVar60 & 0xf) != 0) goto LAB_0013c03e;
                            if (uVar60 < 0xf0) {
                              psVar28->eob_run = ~(-1 << ((byte)uVar41 & 0x1f));
                              if (0xf < uVar60) {
                                iVar22 = stbi__jpeg_get_bits(psVar28,uVar41);
                                psVar28->eob_run = psVar28->eob_run + iVar22;
                              }
                              uVar41 = 0x40;
                            }
                            else {
                              uVar41 = 0xf;
                            }
                            sVar40 = 0;
                          }
                          uVar52 = (long)(int)uVar37;
                          do {
                            while( true ) {
                              uVar37 = uVar52;
                              iVar22 = psVar28->spec_end;
                              if ((long)iVar22 < (long)uVar37) goto LAB_0013b901;
                              bVar13 = ""[uVar37];
                              if (psVar61[bVar13] == 0) break;
                              iVar22 = stbi__jpeg_get_bit(psVar28);
                              if ((iVar22 != 0) &&
                                 (sVar6 = psVar61[bVar13], (iVar21 >> 0x10 & (int)sVar6) == 0)) {
                                sVar10 = (short)((uint)iVar21 >> 0x10);
                                if (sVar6 < 1) {
                                  sVar10 = -sVar10;
                                }
                                psVar61[bVar13] = sVar6 + sVar10;
                              }
                              uVar52 = uVar37 + 1;
                            }
                            bVar63 = uVar41 != 0;
                            uVar41 = uVar41 - 1;
                            uVar52 = uVar37 + 1;
                          } while (bVar63);
                          psVar61[bVar13] = sVar40;
                          uVar37 = uVar37 + 1;
LAB_0013b901:
                        } while ((int)uVar37 <= iVar22);
                      }
                      else {
                        psVar28->eob_run = iVar22 + -1;
                        uVar60 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                        for (; (long)uVar37 <= (long)psVar28->spec_end; uVar37 = uVar37 + 1) {
                          bVar12 = ""[uVar37];
                          if (((psVar61[bVar12] != 0) &&
                              (iVar21 = stbi__jpeg_get_bit(psVar28), iVar21 != 0)) &&
                             (sVar40 = psVar61[bVar12], (uVar60 & (int)sVar40) == 0)) {
                            uVar41 = -uVar60;
                            if (0 < sVar40) {
                              uVar41 = uVar60;
                            }
                            psVar61[bVar12] = (short)uVar41 + sVar40;
                          }
                        }
                      }
                    }
                    iVar21 = psVar28->todo;
                    psVar28->todo = iVar21 + -1;
                    if (iVar21 < 2) {
                      if (psVar28->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar28);
                      }
                      bVar12 = psVar28->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_0013bec3;
                      stbi__jpeg_reset(psVar28);
                    }
                  }
                }
              }
              else {
                for (iVar19 = 0; iVar19 < psVar28->img_mcu_y; iVar19 = iVar19 + 1) {
                  for (iVar27 = 0; iVar27 < psVar28->img_mcu_x; iVar27 = iVar27 + 1) {
                    for (lVar30 = 0; lVar30 < psVar28->scan_n; lVar30 = lVar30 + 1) {
                      iVar50 = psVar28->order[lVar30];
                      for (iVar44 = 0; iVar44 < paVar1[iVar50].v; iVar44 = iVar44 + 1) {
                        iVar45 = 0;
                        while (iVar45 < paVar1[iVar50].h) {
                          iVar21 = stbi__jpeg_decode_block_prog_dc
                                             (psVar28,paVar1[iVar50].coeff +
                                                      (paVar1[iVar50].h * iVar27 + iVar45 +
                                                      (paVar1[iVar50].v * iVar19 + iVar44) *
                                                      paVar1[iVar50].coeff_w) * 0x40,
                                              (stbi__huffman *)
                                              psVar28->huff_dc[paVar1[iVar50].hd].fast,iVar50);
                          iVar45 = iVar45 + 1;
                          if (iVar21 == 0) goto LAB_0013c04e;
                        }
                      }
                    }
                    iVar50 = psVar28->todo;
                    psVar28->todo = iVar50 + -1;
                    if (iVar50 < 2) {
                      if (psVar28->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar28);
                      }
                      bVar12 = psVar28->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_0013bec3;
                      stbi__jpeg_reset(psVar28);
                    }
                  }
                }
              }
              bVar12 = psVar28->marker;
LAB_0013bec3:
              if (bVar12 == 0xff) {
                do {
                  iVar19 = stbi__at_eof(psVar28->s);
                  if (iVar19 != 0) goto LAB_0013b494;
                  sVar14 = stbi__get8(psVar28->s);
                } while (sVar14 != 0xff);
                sVar14 = stbi__get8(psVar28->s);
                psVar28->marker = sVar14;
              }
              goto LAB_0013b494;
            }
          }
LAB_0013c03e:
          *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
          goto LAB_0013c04e;
        }
        if (bVar12 == 0xdc) {
          iVar19 = stbi__get16be(psVar28->s);
          sVar20 = stbi__get16be(psVar28->s);
          if ((iVar19 != 4) || (sVar20 != psVar28->s->img_y)) goto LAB_0013c03e;
LAB_0013b494:
          bVar12 = stbi__get_marker(psVar28);
          goto LAB_0013b430;
        }
        if (bVar12 != 0xd9) {
          iVar19 = stbi__process_marker(psVar28,(uint)bVar12);
          if (iVar19 != 0) goto LAB_0013b494;
          goto LAB_0013c04e;
        }
        if (psVar28->progressive == 0) {
          psVar43 = psVar28->s;
          uVar60 = psVar43->img_n;
        }
        else {
          lVar30 = 0;
          while( true ) {
            psVar43 = psVar28->s;
            uVar60 = psVar43->img_n;
            if ((int)uVar60 <= lVar30) break;
            uVar60 = psVar28->img_comp[lVar30].x + 7 >> 3;
            iVar19 = psVar28->img_comp[lVar30].y + 7 >> 3;
            uVar52 = 0;
            uVar37 = (ulong)uVar60;
            if ((int)uVar60 < 1) {
              uVar37 = uVar52;
            }
            if (iVar19 < 1) {
              iVar19 = 0;
            }
            while (iVar27 = (int)uVar52, iVar27 != iVar19) {
              for (uVar52 = 0; uVar52 != uVar37; uVar52 = uVar52 + 1) {
                psVar61 = paVar1[lVar30].coeff;
                iVar44 = paVar1[lVar30].coeff_w * iVar27;
                iVar50 = paVar1[lVar30].tq;
                iVar45 = iVar44 + (int)uVar52;
                for (lVar46 = 0; lVar46 != 0x40; lVar46 = lVar46 + 1) {
                  psVar61[iVar45 * 0x40 + lVar46] =
                       psVar61[iVar45 * 0x40 + lVar46] * psVar28->dequant[iVar50][lVar46];
                }
                (*psVar28->idct_block_kernel)
                          (paVar1[lVar30].data + uVar52 * 8 + (long)(iVar27 * 8 * paVar1[lVar30].w2)
                           ,paVar1[lVar30].w2,psVar61 + (iVar44 + (int)uVar52) * 0x40);
              }
              uVar52 = (ulong)(iVar27 + 1);
            }
            lVar30 = lVar30 + 1;
          }
        }
        uVar41 = (2 < (int)uVar60) + 1 + (uint)(2 < (int)uVar60);
        if (req_comp != 0) {
          uVar41 = req_comp;
        }
        lVar30 = 0;
        bVar63 = false;
        if ((uVar60 == 3) && (bVar63 = true, psVar28->rgb != 3)) {
          if (psVar28->app14_color_transform == 0) {
            bVar63 = psVar28->jfif == 0;
          }
          else {
            bVar63 = false;
          }
        }
        uVar37 = 0;
        if (0 < (int)uVar60) {
          uVar37 = (ulong)uVar60;
        }
        uVar52 = 1;
        if (bVar63) {
          uVar52 = uVar37;
        }
        if (2 < (int)uVar41) {
          uVar52 = uVar37;
        }
        coutput[2] = (stbi_uc *)0x0;
        coutput[3] = (stbi_uc *)0x0;
        coutput[0] = (stbi_uc *)0x0;
        coutput[1] = (stbi_uc *)0x0;
        if (uVar60 != 3) {
          uVar52 = uVar37;
        }
        do {
          if (uVar52 * 0x30 == lVar30) {
            sVar20 = psVar43->img_y;
            data_00 = (stbi__context *)stbi__malloc_mad3(uVar41,psVar43->img_x,sVar20,1);
            if (data_00 != (stbi__context *)0x0) {
              iVar19 = 0;
              uVar60 = 0;
              do {
                if (sVar20 <= uVar60) {
                  stbi__cleanup_jpeg(psVar28);
                  psVar43 = psVar28->s;
                  *x = psVar43->img_x;
                  *y = psVar43->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar43->img_n) * 2 + 1;
                  }
                  goto LAB_0013c05d;
                }
                sVar20 = psVar43->img_x;
                ppsVar58 = coutput;
                for (lVar30 = 0; uVar52 * 0x30 != lVar30; lVar30 = lVar30 + 0x30) {
                  puVar35 = (undefined8 *)((long)data + lVar30 + 0x10);
                  iVar27 = *(int *)((long)data + lVar30 + 0x24);
                  iVar50 = *(int *)((long)data + lVar30 + 0x1c);
                  iVar44 = iVar50 >> 1;
                  puVar2 = (undefined8 *)((long)data + lVar30 + 8);
                  puVar38 = puVar35;
                  if (iVar27 < iVar44) {
                    puVar38 = puVar2;
                  }
                  if (iVar44 <= iVar27) {
                    puVar35 = puVar2;
                  }
                  psVar36 = (stbi_uc *)
                            (**(code **)((long)data + lVar30))
                                      (*(undefined8 *)
                                        ((long)&psVar28->img_comp[0].linebuf + lVar30 * 2),*puVar38,
                                       *puVar35,*(undefined4 *)((long)data + lVar30 + 0x20));
                  *ppsVar58 = psVar36;
                  *(int *)((long)data + lVar30 + 0x24) = iVar27 + 1;
                  if (iVar50 <= iVar27 + 1) {
                    *(undefined4 *)((long)data + lVar30 + 0x24) = 0;
                    lVar46 = *(long *)((long)data + lVar30 + 0x10);
                    *(long *)((long)data + lVar30 + 8) = lVar46;
                    iVar27 = *(int *)((long)data + lVar30 + 0x28) + 1;
                    *(int *)((long)data + lVar30 + 0x28) = iVar27;
                    if (iVar27 < *(int *)((long)&psVar28->img_comp[0].y + lVar30 * 2)) {
                      *(long *)((long)data + lVar30 + 0x10) =
                           lVar46 + *(int *)((long)&psVar28->img_comp[0].w2 + lVar30 * 2);
                    }
                  }
                  ppsVar58 = ppsVar58 + 1;
                }
                if ((int)uVar41 < 3) {
                  psVar43 = psVar28->s;
                  if (bVar63) {
                    uVar37 = (ulong)(sVar20 * iVar19);
                    if (uVar41 == 1) {
                      for (uVar47 = 0; uVar47 < psVar43->img_x; uVar47 = uVar47 + 1) {
                        data_00->buffer_start[uVar47 + uVar37 + -0x38] =
                             (stbi_uc)((uint)coutput[2][uVar47] * 0x1d +
                                       (uint)coutput[1][uVar47] * 0x96 +
                                       (uint)coutput[0][uVar47] * 0x4d >> 8);
                      }
                    }
                    else {
                      for (uVar47 = 0; uVar47 < psVar43->img_x; uVar47 = uVar47 + 1) {
                        data_00->buffer_start[uVar47 * 2 + uVar37 + -0x38] =
                             (stbi_uc)((uint)coutput[2][uVar47] * 0x1d +
                                       (uint)coutput[1][uVar47] * 0x96 +
                                       (uint)coutput[0][uVar47] * 0x4d >> 8);
                        data_00->buffer_start[uVar47 * 2 + uVar37 + -0x37] = 0xff;
                      }
                    }
                  }
                  else if (psVar43->img_n == 4) {
                    if (psVar28->app14_color_transform == 2) {
                      psVar36 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar37 = 0; uVar37 < psVar43->img_x; uVar37 = uVar37 + 1) {
                        iVar27 = (coutput[0][uVar37] ^ 0xff) * (uint)coutput[3][uVar37];
                        psVar36[-1] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        *psVar36 = 0xff;
                        psVar36 = psVar36 + uVar41;
                      }
                    }
                    else {
                      if (psVar28->app14_color_transform != 0) goto LAB_0013d6e7;
                      psVar36 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar37 = 0; uVar37 < psVar43->img_x; uVar37 = uVar37 + 1) {
                        bVar12 = coutput[3][uVar37];
                        iVar27 = (uint)coutput[0][uVar37] * (uint)bVar12;
                        iVar50 = (uint)coutput[1][uVar37] * (uint)bVar12;
                        psVar36[-1] = (char)((((uint)coutput[2][uVar37] * (uint)bVar12 + 0x80 >> 8)
                                              + (uint)coutput[2][uVar37] * (uint)bVar12 + 0x80 >> 8)
                                             * 0x1d + (iVar50 + (iVar50 + 0x80U >> 8) + 0x80 >> 8) *
                                                      0x96 + (iVar27 + (iVar27 + 0x80U >> 8) + 0x80
                                                             >> 8) * 0x4d >> 8);
                        *psVar36 = 0xff;
                        psVar36 = psVar36 + uVar41;
                      }
                    }
                  }
                  else {
LAB_0013d6e7:
                    uVar37 = (ulong)(sVar20 * iVar19);
                    if (uVar41 == 1) {
                      for (uVar47 = 0; uVar47 < psVar43->img_x; uVar47 = uVar47 + 1) {
                        data_00->buffer_start[uVar47 + uVar37 + -0x38] = coutput[0][uVar47];
                      }
                    }
                    else {
                      for (uVar47 = 0; uVar47 < psVar43->img_x; uVar47 = uVar47 + 1) {
                        data_00->buffer_start[uVar47 * 2 + uVar37 + -0x38] = coutput[0][uVar47];
                        data_00->buffer_start[uVar47 * 2 + uVar37 + -0x37] = 0xff;
                      }
                    }
                  }
                }
                else {
                  psVar43 = psVar28->s;
                  if (psVar43->img_n == 3) {
                    if (bVar63) {
                      psVar36 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar37 = 0; uVar37 < psVar43->img_x; uVar37 = uVar37 + 1) {
                        psVar36[-3] = coutput[0][uVar37];
                        psVar36[-2] = coutput[1][uVar37];
                        psVar36[-1] = coutput[2][uVar37];
                        *psVar36 = 0xff;
                        psVar36 = psVar36 + uVar41;
                      }
                    }
                    else {
LAB_0013d71d:
                      (*psVar28->YCbCr_to_RGB_kernel)
                                (data_00->buffer_start + ((ulong)(uVar60 * uVar41 * sVar20) - 0x38),
                                 coutput[0],coutput[1],coutput[2],psVar43->img_x,uVar41);
                    }
                  }
                  else if (psVar43->img_n == 4) {
                    if (psVar28->app14_color_transform == 2) {
                      (*psVar28->YCbCr_to_RGB_kernel)
                                (data_00->buffer_start + ((ulong)(uVar60 * uVar41 * sVar20) - 0x38),
                                 coutput[0],coutput[1],coutput[2],psVar43->img_x,uVar41);
                      psVar43 = psVar28->s;
                      psVar36 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x36);
                      for (uVar37 = 0; uVar37 < psVar43->img_x; uVar37 = uVar37 + 1) {
                        bVar12 = coutput[3][uVar37];
                        iVar27 = (psVar36[-2] ^ 0xff) * (uint)bVar12;
                        psVar36[-2] = (byte)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (psVar36[-1] ^ 0xff) * (uint)bVar12;
                        psVar36[-1] = (byte)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (*psVar36 ^ 0xff) * (uint)bVar12;
                        *psVar36 = (byte)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        psVar36 = psVar36 + uVar41;
                      }
                    }
                    else {
                      if (psVar28->app14_color_transform != 0) goto LAB_0013d71d;
                      psVar36 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar37 = 0; uVar37 < psVar43->img_x; uVar37 = uVar37 + 1) {
                        bVar12 = coutput[3][uVar37];
                        iVar27 = (uint)coutput[0][uVar37] * (uint)bVar12;
                        psVar36[-3] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (uint)coutput[1][uVar37] * (uint)bVar12;
                        psVar36[-2] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        psVar36[-1] = (char)(((uint)coutput[2][uVar37] * (uint)bVar12 + 0x80 >> 8) +
                                             (uint)coutput[2][uVar37] * (uint)bVar12 + 0x80 >> 8);
                        *psVar36 = 0xff;
                        psVar36 = psVar36 + uVar41;
                      }
                    }
                  }
                  else {
                    psVar36 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                    for (uVar37 = 0; uVar37 < psVar43->img_x; uVar37 = uVar37 + 1) {
                      sVar14 = coutput[0][uVar37];
                      psVar36[-1] = sVar14;
                      psVar36[-2] = sVar14;
                      psVar36[-3] = sVar14;
                      *psVar36 = 0xff;
                      psVar36 = psVar36 + uVar41;
                    }
                  }
                }
                uVar60 = uVar60 + 1;
                psVar43 = psVar28->s;
                sVar20 = psVar43->img_y;
                iVar19 = iVar19 + uVar41;
              } while( true );
            }
            stbi__cleanup_jpeg(psVar28);
LAB_0013d8c8:
            pcVar29 = "Out of memory";
            goto LAB_0013b34d;
          }
          sVar20 = psVar43->img_x;
          pvVar33 = malloc((ulong)(sVar20 + 3));
          *(void **)((long)&psVar28->img_comp[0].linebuf + lVar30 * 2) = pvVar33;
          if (pvVar33 == (void *)0x0) {
            stbi__cleanup_jpeg(psVar28);
            goto LAB_0013d8c8;
          }
          uVar37 = (long)psVar28->img_h_max /
                   (long)*(int *)((long)&psVar28->img_comp[0].h + lVar30 * 2);
          iVar19 = (int)uVar37;
          *(int *)((long)data + lVar30 + 0x18) = iVar19;
          iVar27 = psVar28->img_v_max / *(int *)((long)&psVar28->img_comp[0].v + lVar30 * 2);
          *(int *)((long)data + lVar30 + 0x1c) = iVar27;
          *(int *)((long)data + lVar30 + 0x24) = iVar27 >> 1;
          *(int *)((long)data + lVar30 + 0x20) =
               (int)((ulong)((sVar20 + iVar19) - 1) / (uVar37 & 0xffffffff));
          *(undefined4 *)((long)data + lVar30 + 0x28) = 0;
          uVar8 = *(undefined8 *)((long)&psVar28->img_comp[0].data + lVar30 * 2);
          *(undefined8 *)((long)data + lVar30 + 0x10) = uVar8;
          *(undefined8 *)((long)data + lVar30 + 8) = uVar8;
          if (iVar19 == 2) {
            pcVar34 = stbi__resample_row_h_2;
            if (iVar27 != 1) {
              if (iVar27 != 2) goto LAB_0013d261;
              pcVar34 = psVar28->resample_row_hv_2_kernel;
            }
          }
          else if (iVar19 == 1) {
            pcVar34 = stbi__resample_row_generic;
            if (iVar27 == 2) {
              pcVar34 = stbi__resample_row_v_2;
            }
            if (iVar27 == 1) {
              pcVar34 = resample_row_1;
            }
          }
          else {
LAB_0013d261:
            pcVar34 = stbi__resample_row_generic;
          }
          *(code **)((long)data + lVar30) = pcVar34;
          lVar30 = lVar30 + 0x30;
        } while( true );
      }
LAB_0013c04e:
      stbi__cleanup_jpeg(psVar28);
    }
    else {
      pcVar29 = "Internal error";
LAB_0013b34d:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar29;
    }
    data_00 = (stbi__context *)0x0;
    goto LAB_0013c05d;
  }
  iVar19 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar19 != 0) {
    if ((uint)req_comp < 5) {
      data._0_8_ = s;
      iVar19 = stbi__parse_png_file((stbi__png *)data,0,req_comp);
      uVar8 = data._0_8_;
      if (iVar19 == 0) {
        data_00 = (stbi__context *)0x0;
      }
      else {
        iVar19 = 8;
        if (8 < (int)data._32_4_) {
          iVar19 = data._32_4_;
        }
        ri->bits_per_channel = iVar19;
        if ((req_comp != 0) && (iVar19 = *(int *)(data._0_8_ + 0xc), iVar19 != req_comp)) {
          if ((int)data._32_4_ < 9) {
            data._24_8_ = stbi__convert_format
                                    ((uchar *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                                     *(uint *)(data._0_8_ + 4));
          }
          else {
            data._24_8_ = stbi__convert_format16
                                    ((stbi__uint16 *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_
                                     ,*(uint *)(data._0_8_ + 4));
          }
          *(int *)(uVar8 + 0xc) = req_comp;
          if ((stbi__context *)data._24_8_ == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(int *)uVar8;
        *y = *(int *)(uVar8 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar8 + 8);
        }
        data_00 = (stbi__context *)data._24_8_;
        data._24_8_ = (void *)0x0;
      }
      free((void *)data._24_8_);
      free((void *)data._16_8_);
      psVar28 = (stbi__jpeg *)data._8_8_;
      goto LAB_0013c05d;
    }
    pcVar29 = "Internal error";
    goto LAB_0013b3a2;
  }
  sVar14 = stbi__get8(s);
  if ((sVar14 == 'B') && (sVar14 = stbi__get8(s), sVar14 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar20 = stbi__get32le(s);
    if (((0x38 < sVar20) || ((0x100010000001000U >> ((ulong)sVar20 & 0x3f) & 1) == 0)) &&
       ((sVar20 != 0x7c && (sVar20 != 0x6c)))) goto LAB_0013c0ee;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    coutput[3] = (stbi_uc *)CONCAT44(0xff,(uint)coutput[3]);
    pvVar33 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
    if (pvVar33 == (void *)0x0) {
      return (void *)0x0;
    }
    sVar20 = s->img_y;
    sVar24 = -sVar20;
    if (0 < (int)sVar20) {
      sVar24 = sVar20;
    }
    s->img_y = sVar24;
    uVar60 = (uint)coutput[3];
    local_8960 = coutput[3]._4_4_;
    if ((int)coutput[1] == 0xc) {
      if ((int)coutput[0] < 0x18) {
        uVar41 = (int)((coutput[0]._4_4_ - local_88c8) + -0x18) / 3;
        goto LAB_0013c358;
      }
LAB_0013c331:
      uVar59 = 0;
      uVar41 = 0;
      if ((int)coutput[0] != 0x18 || (uint)coutput[3] != 0xff000000) goto LAB_0013c358;
      iVar27 = 3;
      iVar19 = 0x18;
      bVar63 = true;
    }
    else {
      if (0xf < (int)coutput[0]) goto LAB_0013c331;
      uVar41 = (int)(coutput[0]._4_4_ - (local_88c8 + (int)coutput[1])) >> 2;
LAB_0013c358:
      uVar59 = uVar41;
      bVar63 = (uint)coutput[3] == 0xff000000;
      iVar27 = 4 - (uint)((uint)coutput[3] == 0);
      iVar19 = (int)coutput[0];
    }
    s->img_n = iVar27;
    if (2 < req_comp) {
      iVar27 = req_comp;
    }
    sVar25 = s->img_x;
    iVar50 = stbi__mad3sizes_valid(iVar27,sVar25,sVar24,0);
    if (iVar50 == 0) {
LAB_0013d09d:
      pcVar29 = "Corrupt BMP";
      goto LAB_0013b3a2;
    }
    puVar31 = (uchar *)stbi__malloc_mad3(iVar27,sVar25,sVar24,0);
    if (puVar31 != (uchar *)0x0) {
      if (0xf < iVar19) {
        stbi__skip(s,coutput[0]._4_4_ - ((int)coutput[1] + local_88c8));
        if (iVar19 == 0x10) {
          local_88ec = s->img_x * 2 & 2;
LAB_0013ce6f:
          if (coutput[2]._4_4_ == 0 || ((uint)coutput[2] == 0 || coutput[1]._4_4_ == 0))
          goto LAB_0013d095;
          iVar50 = stbi__high_bit(coutput[1]._4_4_);
          iVar50 = iVar50 + -7;
          iVar44 = stbi__bitcount(coutput[1]._4_4_);
          iVar45 = stbi__high_bit((uint)coutput[2]);
          iVar45 = iVar45 + -7;
          iVar21 = stbi__bitcount((uint)coutput[2]);
          iVar22 = stbi__high_bit(coutput[2]._4_4_);
          iVar22 = iVar22 + -7;
          local_88b0 = stbi__bitcount(coutput[2]._4_4_);
          local_88b4 = stbi__high_bit(uVar60);
          local_88b4 = local_88b4 + -7;
          local_88b8 = stbi__bitcount(uVar60);
          bVar11 = true;
          bVar63 = false;
        }
        else {
          if (iVar19 == 0x20) {
            local_88ec = 0;
            if (!(bool)((coutput[1]._4_4_ == 0xff0000 &&
                        ((uint)coutput[2] == 0xff00 && coutput[2]._4_4_ == 0xff)) & bVar63))
            goto LAB_0013ce6f;
            bVar63 = true;
          }
          else {
            local_88ec = 0;
            if (iVar19 != 0x18) goto LAB_0013ce6f;
            local_88ec = s->img_x & 3;
            bVar63 = false;
          }
          bVar11 = false;
          iVar50 = 0;
          iVar45 = 0;
          iVar22 = 0;
          local_88b4 = 0;
          iVar44 = 0;
          iVar21 = 0;
          local_88b0 = 0;
          local_88b8 = 0;
        }
        uVar37 = 0;
        for (iVar23 = 0; sVar24 = s->img_y, iVar23 < (int)sVar24; iVar23 = iVar23 + 1) {
          if (bVar11) {
            for (iVar55 = 0; iVar55 < (int)s->img_x; iVar55 = iVar55 + 1) {
              if (iVar19 == 0x10) {
                uVar41 = stbi__get16le(s);
              }
              else {
                uVar41 = stbi__get32le(s);
              }
              iVar26 = stbi__shiftsigned(uVar41 & coutput[1]._4_4_,iVar50,iVar44);
              lVar30 = (long)(int)uVar37;
              puVar31[lVar30] = (uchar)iVar26;
              iVar26 = stbi__shiftsigned(uVar41 & (uint)coutput[2],iVar45,iVar21);
              puVar31[lVar30 + 1] = (uchar)iVar26;
              iVar26 = stbi__shiftsigned(uVar41 & coutput[2]._4_4_,iVar22,local_88b0);
              puVar31[lVar30 + 2] = (uchar)iVar26;
              if (uVar60 == 0) {
                uVar41 = 0xff;
              }
              else {
                uVar41 = stbi__shiftsigned(uVar41 & uVar60,local_88b4,local_88b8);
              }
              uVar52 = lVar30 + 3;
              if (iVar27 == 4) {
                puVar31[lVar30 + 3] = (uchar)uVar41;
                uVar52 = (ulong)((int)uVar37 + 4);
              }
              local_8960 = local_8960 | uVar41;
              uVar37 = uVar52 & 0xffffffff;
            }
          }
          else {
            for (iVar55 = 0; iVar55 < (int)s->img_x; iVar55 = iVar55 + 1) {
              sVar14 = stbi__get8(s);
              lVar30 = (long)(int)uVar37;
              puVar31[lVar30 + 2] = sVar14;
              sVar14 = stbi__get8(s);
              puVar31[lVar30 + 1] = sVar14;
              sVar14 = stbi__get8(s);
              puVar31[lVar30] = sVar14;
              bVar12 = 0xff;
              if (bVar63) {
                bVar12 = stbi__get8(s);
              }
              uVar52 = lVar30 + 3;
              if (iVar27 == 4) {
                puVar31[lVar30 + 3] = bVar12;
                uVar52 = (ulong)((int)uVar37 + 4);
              }
              local_8960 = local_8960 | bVar12;
              uVar37 = uVar52 & 0xffffffff;
            }
          }
          stbi__skip(s,local_88ec);
        }
LAB_0013daf8:
        if ((iVar27 == 4) && (local_8960 == 0)) {
          for (uVar60 = s->img_x * sVar24 * 4 - 1; -1 < (int)uVar60; uVar60 = uVar60 - 4) {
            puVar31[uVar60] = 0xff;
          }
        }
        if (0 < (int)sVar20) {
          iVar19 = (int)sVar24 >> 1;
          if ((int)sVar24 >> 1 < 1) {
            iVar19 = 0;
          }
          iVar50 = (sVar24 - 1) * iVar27;
          iVar45 = 0;
          for (iVar44 = 0; iVar44 != iVar19; iVar44 = iVar44 + 1) {
            sVar20 = s->img_x;
            uVar37 = (ulong)(sVar20 * iVar27);
            if ((int)(sVar20 * iVar27) < 1) {
              uVar37 = 0;
            }
            for (uVar52 = 0; uVar37 != uVar52; uVar52 = uVar52 + 1) {
              uVar4 = puVar31[uVar52 + sVar20 * iVar45];
              puVar31[uVar52 + sVar20 * iVar45] = puVar31[uVar52 + sVar20 * iVar50];
              puVar31[uVar52 + sVar20 * iVar50] = uVar4;
            }
            iVar50 = iVar50 - iVar27;
            iVar45 = iVar45 + iVar27;
          }
        }
        uVar60 = s->img_x;
        if ((req_comp != 0) && (iVar27 != req_comp)) {
          puVar31 = stbi__convert_format(puVar31,iVar27,req_comp,uVar60,sVar24);
          if (puVar31 == (uchar *)0x0) {
            return (void *)0x0;
          }
          uVar60 = s->img_x;
        }
        *x = uVar60;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return puVar31;
        }
        return puVar31;
      }
      if ((int)uVar59 < 0x101 && uVar59 != 0) {
        uVar52 = 0;
        uVar37 = 0;
        if (0 < (int)uVar59) {
          uVar37 = (ulong)uVar59;
        }
        for (; uVar37 != uVar52; uVar52 = uVar52 + 1) {
          sVar14 = stbi__get8(s);
          *(stbi_uc *)(data + uVar52 * 2 + 1) = sVar14;
          sVar14 = stbi__get8(s);
          *(stbi_uc *)((long)data + uVar52 * 4 + 1) = sVar14;
          sVar14 = stbi__get8(s);
          *(stbi_uc *)(data + uVar52 * 2) = sVar14;
          if ((int)coutput[1] != 0xc) {
            stbi__get8(s);
          }
          *(undefined1 *)((long)data + uVar52 * 4 + 3) = 0xff;
        }
        stbi__skip(s,(uVar59 * ((int)coutput[1] == 0xc | 0xfffffffc) + coutput[0]._4_4_) -
                     ((int)coutput[1] + local_88c8));
        if (iVar19 == 1) {
          sVar25 = s->img_x;
          iVar19 = 0;
          uVar37 = 0;
LAB_0013da40:
          sVar24 = s->img_y;
          if (iVar19 < (int)sVar24) {
            iVar50 = 0;
            do {
              bVar12 = stbi__get8(s);
              sVar24 = s->img_x;
              iVar44 = 8;
              do {
                if ((int)sVar24 <= iVar50) {
LAB_0013dadd:
                  uVar37 = uVar37 & 0xffffffff;
                  stbi__skip(s,-(sVar25 + 7 >> 3) & 3);
                  iVar19 = iVar19 + 1;
                  goto LAB_0013da40;
                }
                uVar52 = (ulong)((bVar12 >> (iVar44 - 1U & 0x1f) & 1) != 0);
                iVar45 = (int)uVar37;
                lVar30 = (long)iVar45;
                uVar37 = lVar30 + 3;
                puVar31[lVar30] = (uchar)data[uVar52 * 2];
                puVar31[lVar30 + 1] = *(uchar *)((long)data + uVar52 * 4 + 1);
                puVar31[lVar30 + 2] = (uchar)data[uVar52 * 2 + 1];
                if (iVar27 == 4) {
                  puVar31[lVar30 + 3] = 0xff;
                  uVar37 = (ulong)(iVar45 + 4);
                }
                if (sVar24 - 1 == iVar50) goto LAB_0013dadd;
                iVar50 = iVar50 + 1;
                iVar45 = iVar44 + -1;
                bVar63 = 0 < iVar44;
                iVar44 = iVar45;
              } while (iVar45 != 0 && bVar63);
            } while( true );
          }
          goto LAB_0013daf8;
        }
        if (iVar19 == 8) {
          uVar60 = s->img_x;
        }
        else {
          if (iVar19 != 4) goto LAB_0013d095;
          uVar60 = s->img_x + 1 >> 1;
        }
        uVar37 = 0;
        local_8978 = -uVar60 & 3;
        for (iVar50 = 0; sVar24 = s->img_y, iVar50 < (int)sVar24; iVar50 = iVar50 + 1) {
          for (iVar44 = 0; iVar44 < (int)s->img_x; iVar44 = iVar44 + 2) {
            bVar12 = stbi__get8(s);
            uVar60 = (uint)(bVar12 >> 4);
            if (iVar19 != 4) {
              uVar60 = (uint)bVar12;
            }
            uVar52 = (ulong)uVar60;
            uVar60 = bVar12 & 0xf;
            if (iVar19 != 4) {
              uVar60 = 0;
            }
            lVar30 = (long)(int)uVar37;
            uVar47 = lVar30 + 3;
            puVar31[lVar30] = (uchar)data[uVar52 * 2];
            puVar31[lVar30 + 1] = *(uchar *)((long)data + uVar52 * 4 + 1);
            puVar31[lVar30 + 2] = (uchar)data[uVar52 * 2 + 1];
            if (iVar27 == 4) {
              puVar31[lVar30 + 3] = 0xff;
              uVar47 = (ulong)((int)uVar37 + 4);
            }
            if (iVar44 + 1U == s->img_x) {
              uVar37 = uVar47 & 0xffffffff;
              break;
            }
            if (iVar19 == 8) {
              bVar12 = stbi__get8(s);
              uVar60 = (uint)bVar12;
            }
            lVar30 = (long)(int)uVar47;
            uVar37 = lVar30 + 3;
            uVar52 = (ulong)uVar60;
            puVar31[lVar30] = (uchar)data[uVar52 * 2];
            puVar31[lVar30 + 1] = *(uchar *)((long)data + uVar52 * 4 + 1);
            puVar31[lVar30 + 2] = (uchar)data[uVar52 * 2 + 1];
            if (iVar27 == 4) {
              puVar31[lVar30 + 3] = 0xff;
              uVar37 = (ulong)((int)uVar47 + 4);
            }
          }
          stbi__skip(s,local_8978);
        }
        goto LAB_0013daf8;
      }
LAB_0013d095:
      free(puVar31);
      goto LAB_0013d09d;
    }
    goto LAB_0013cdbe;
  }
LAB_0013c0ee:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar19 = stbi__gif_test(s);
  if (iVar19 != 0) {
    memset((stbi__gif *)data,0,0x8870);
    data_00 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)data,comp,0,psVar36);
    if (data_00 == (stbi__context *)0x0 || data_00 == s) {
      free((void *)data._8_8_);
      data_00 = (stbi__context *)0x0;
    }
    else {
      *x = data._0_4_;
      *y = data._4_4_;
      if ((req_comp & 0xfffffffbU) != 0) {
        data_00 = (stbi__context *)
                  stbi__convert_format((uchar *)data_00,4,req_comp,data._0_4_,data._4_4_);
      }
    }
    free((void *)data._24_8_);
    psVar28 = (stbi__jpeg *)data._16_8_;
LAB_0013c05d:
    free(psVar28);
    return data_00;
  }
  sVar20 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar20 == 0x38425053) {
    sVar20 = stbi__get32be(s);
    if (sVar20 != 0x38425053) {
      pcVar29 = "Corrupt PSD image";
      goto LAB_0013b3a2;
    }
    iVar19 = stbi__get16be(s);
    if (iVar19 != 1) {
      pcVar29 = "Unsupported version of PSD image";
      goto LAB_0013b3a2;
    }
    stbi__skip(s,6);
    uVar60 = stbi__get16be(s);
    if (0x10 < uVar60) {
      pcVar29 = "Unsupported number of channels in PSD image";
      goto LAB_0013b3a2;
    }
    sVar20 = stbi__get32be(s);
    sVar24 = stbi__get32be(s);
    iVar19 = stbi__get16be(s);
    if ((iVar19 != 8) && (iVar19 != 0x10)) {
      pcVar29 = "PSD bit depth is not 8 or 16 bit";
      goto LAB_0013b3a2;
    }
    iVar27 = stbi__get16be(s);
    if (iVar27 != 3) {
      pcVar29 = "PSD is not in RGB color format";
      goto LAB_0013b3a2;
    }
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    uVar41 = stbi__get16be(s);
    if (1 < uVar41) {
      pcVar29 = "PSD has an unknown compression format";
      goto LAB_0013b3a2;
    }
    iVar27 = stbi__mad3sizes_valid(4,sVar24,sVar20,0);
    if (iVar27 == 0) {
      pcVar29 = "Corrupt PSD";
      goto LAB_0013b3a2;
    }
    if (((bpc == 0x10) && (iVar19 == 0x10)) && (uVar41 == 0)) {
      data_01 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar24,sVar20,0);
      ri->bits_per_channel = 0x10;
    }
    else {
      data_01 = (stbi__uint16 *)malloc((long)(int)(sVar20 * sVar24 * 4));
    }
    if (data_01 != (stbi__uint16 *)0x0) {
      uVar59 = sVar24 * sVar20;
      if (uVar41 == 0) {
        uVar37 = 0;
        psVar62 = data_01;
        local_8980 = data_01;
        uVar41 = 0;
        if (0 < (int)uVar59) {
          uVar41 = uVar59;
        }
        for (; uVar37 != 4; uVar37 = uVar37 + 1) {
          if (uVar37 < uVar60) {
            if (ri->bits_per_channel == 0x10) {
              for (lVar30 = 0; uVar41 != (uint)lVar30; lVar30 = lVar30 + 1) {
                iVar27 = stbi__get16be(s);
                local_8980[lVar30 * 4] = (stbi__uint16)iVar27;
              }
            }
            else {
              lVar30 = 0;
              if (iVar19 == 0x10) {
                for (; uVar41 != (uint)lVar30; lVar30 = lVar30 + 1) {
                  iVar27 = stbi__get16be(s);
                  *(char *)(psVar62 + lVar30 * 2) = (char)((uint)iVar27 >> 8);
                }
              }
              else {
                for (; uVar41 != (uint)lVar30; lVar30 = lVar30 + 1) {
                  sVar14 = stbi__get8(s);
                  *(stbi_uc *)(psVar62 + lVar30 * 2) = sVar14;
                }
              }
            }
          }
          else if (iVar19 == 0x10 && bpc == 0x10) {
            for (lVar30 = 0; uVar41 != (uint)lVar30; lVar30 = lVar30 + 1) {
              local_8980[lVar30 * 4] = -(ushort)(uVar37 == 3);
            }
          }
          else {
            for (lVar30 = 0; uVar41 != (uint)lVar30; lVar30 = lVar30 + 1) {
              *(char *)(psVar62 + lVar30 * 2) = -(uVar37 == 3);
            }
          }
          psVar62 = (stbi__uint16 *)((long)psVar62 + 1);
          local_8980 = local_8980 + 1;
        }
      }
      else {
        stbi__skip(s,sVar20 * uVar60 * 2);
        uVar37 = 0;
        psVar62 = data_01;
        uVar41 = 0;
        if (0 < (int)uVar59) {
          uVar41 = uVar59;
        }
        for (; uVar37 != 4; uVar37 = uVar37 + 1) {
          if (uVar37 < uVar60) {
            psVar36 = (stbi_uc *)((long)data_01 + uVar37);
            iVar19 = 0;
            do {
              uVar56 = uVar59 - iVar19;
              do {
                if ((int)uVar56 < 1) goto LAB_0013dd8a;
                bVar12 = stbi__get8(s);
              } while (bVar12 == 0x80);
              uVar51 = (uint)bVar12;
              if ((char)bVar12 < '\0') {
                uVar54 = 0x101 - uVar51;
                if (uVar56 < uVar54) goto LAB_0013e2f3;
                sVar14 = stbi__get8(s);
                for (iVar27 = uVar51 - 0x101; iVar27 != 0; iVar27 = iVar27 + 1) {
                  *psVar36 = sVar14;
                  psVar36 = psVar36 + 4;
                }
              }
              else {
                if (uVar56 <= bVar12) {
LAB_0013e2f3:
                  free(data_01);
                  pcVar29 = "bad RLE data";
                  goto LAB_0013b3a2;
                }
                uVar54 = uVar51 + 1;
                uVar56 = uVar54;
                while (bVar63 = uVar56 != 0, uVar56 = uVar56 - 1, bVar63) {
                  sVar14 = stbi__get8(s);
                  *psVar36 = sVar14;
                  psVar36 = psVar36 + 4;
                }
              }
              iVar19 = iVar19 + uVar54;
            } while( true );
          }
          for (lVar30 = 0; uVar41 != (uint)lVar30; lVar30 = lVar30 + 1) {
            *(char *)(psVar62 + lVar30 * 2) = -(uVar37 == 3);
          }
LAB_0013dd8a:
          psVar62 = (stbi__uint16 *)((long)psVar62 + 1);
        }
      }
      if (3 < uVar60) {
        uVar37 = 0;
        if (0 < (int)uVar59) {
          uVar37 = (ulong)uVar59;
        }
        if (ri->bits_per_channel == 0x10) {
          for (uVar52 = 0; uVar37 != uVar52; uVar52 = uVar52 + 1) {
            uVar7 = data_01[uVar52 * 4 + 3];
            if ((uVar7 != 0) && (uVar7 != 0xffff)) {
              fVar65 = 1.0 / ((float)uVar7 / 65535.0);
              fVar64 = (1.0 - fVar65) * 65535.0;
              auVar66._0_4_ =
                   (int)(fVar64 + fVar65 * (float)(*(uint *)(data_01 + uVar52 * 4) & 0xffff));
              auVar66._4_4_ =
                   (int)(fVar64 + fVar65 * (float)(*(uint *)(data_01 + uVar52 * 4) >> 0x10));
              auVar66._8_4_ = (int)(fVar64 + fVar65 * 0.0);
              auVar66._12_4_ = (int)(fVar64 + fVar65 * 0.0);
              auVar66 = pshuflw(auVar66,auVar66,0xe8);
              *(int *)(data_01 + uVar52 * 4) = auVar66._0_4_;
              data_01[uVar52 * 4 + 2] =
                   (stbi__uint16)(int)((float)data_01[uVar52 * 4 + 2] * fVar65 + fVar64);
            }
          }
        }
        else {
          for (uVar52 = 0; uVar37 != uVar52; uVar52 = uVar52 + 1) {
            bVar12 = *(byte *)((long)data_01 + uVar52 * 4 + 3);
            if ((bVar12 != 0) && (bVar12 != 0xff)) {
              fVar65 = 1.0 / ((float)bVar12 / 255.0);
              fVar64 = (1.0 - fVar65) * 255.0;
              *(char *)(data_01 + uVar52 * 2) =
                   (char)(int)((float)(byte)data_01[uVar52 * 2] * fVar65 + fVar64);
              *(char *)((long)data_01 + uVar52 * 4 + 1) =
                   (char)(int)((float)*(byte *)((long)data_01 + uVar52 * 4 + 1) * fVar65 + fVar64);
              *(char *)(data_01 + uVar52 * 2 + 1) =
                   (char)(int)((float)(byte)data_01[uVar52 * 2 + 1] * fVar65 + fVar64);
            }
          }
        }
      }
      if ((req_comp & 0xfffffffbU) != 0) {
        if (ri->bits_per_channel == 0x10) {
          data_01 = stbi__convert_format16(data_01,4,req_comp,sVar24,sVar20);
        }
        else {
          data_01 = (stbi__uint16 *)stbi__convert_format((uchar *)data_01,4,req_comp,sVar24,sVar20);
        }
        if (data_01 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      *y = sVar20;
      *x = sVar24;
      return data_01;
    }
  }
  else {
    iVar19 = stbi__pic_is4(s,anon_var_dwarf_177d9e);
    if (iVar19 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar19 = 0x54;
      while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
        stbi__get8(s);
      }
      iVar19 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar19 != 0) {
        iVar19 = 0x5c;
        while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
          stbi__get8(s);
        }
        uVar60 = stbi__get16be(s);
        uVar41 = stbi__get16be(s);
        iVar19 = stbi__at_eof(s);
        if (iVar19 != 0) {
          pcVar29 = "file too short (pic header)";
          goto LAB_0013b3a2;
        }
        bVar12 = 0;
        iVar19 = stbi__mad3sizes_valid(uVar60,uVar41,4,0);
        if (iVar19 == 0) {
          pcVar29 = "PIC image too large to decode";
          goto LAB_0013b3a2;
        }
        stbi__get32be(s);
        stbi__get16be(s);
        stbi__get16be(s);
        psVar28 = (stbi__jpeg *)stbi__malloc_mad3(uVar60,uVar41,4,0);
        uVar59 = uVar60 * 4;
        memset(psVar28,0xff,(ulong)(uVar59 * uVar41));
        pbVar57 = (byte *)(data + 1);
        lVar30 = 0;
        psVar43 = (stbi__context *)(ulong)uVar59;
        do {
          if (lVar30 == 10) {
            pcVar29 = "too many packets";
LAB_0013d8ed:
            iVar19 = (int)psVar43;
            *(char **)(in_FS_OFFSET + -0x10) = pcVar29;
            goto LAB_0013de93;
          }
          sVar14 = stbi__get8(s);
          bVar13 = stbi__get8(s);
          pbVar57[-2] = bVar13;
          bVar16 = stbi__get8(s);
          pbVar57[-1] = bVar16;
          bVar16 = stbi__get8(s);
          *pbVar57 = bVar16;
          iVar19 = stbi__at_eof(s);
          psVar43 = s;
          if (iVar19 != 0) {
            pcVar29 = "file too short (reading packets)";
            goto LAB_0013d8ed;
          }
          if (bVar13 != 8) {
            pcVar29 = "packet isn\'t 8bpp";
            goto LAB_0013d8ed;
          }
          bVar12 = bVar12 | bVar16;
          pbVar57 = pbVar57 + 3;
          lVar30 = lVar30 + 1;
        } while (sVar14 != '\0');
        iVar19 = 4 - (uint)((bVar12 & 0x10) == 0);
        if (comp != (int *)0x0) {
          *comp = iVar19;
        }
        for (uVar37 = 0; uVar37 != uVar41; uVar37 = uVar37 + 1) {
          psVar36 = psVar28->huff_dc[0].fast + (long)(int)(uVar59 * (int)uVar37) + -8;
          for (lVar46 = 0; lVar30 != lVar46; lVar46 = lVar46 + 1) {
            lVar9 = lVar46 * 3;
            cVar3 = *(char *)((long)data + lVar9 + 1);
            psVar53 = psVar36;
            uVar56 = uVar60;
            if (cVar3 == '\0') {
              while (bVar63 = uVar56 != 0, uVar56 = uVar56 - 1, bVar63) {
                psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar53);
                if (psVar32 == (stbi_uc *)0x0) goto LAB_0013de93;
                psVar53 = psVar53 + 4;
              }
            }
            else if (cVar3 == '\x01') {
              for (; 0 < (int)uVar56; uVar56 = uVar56 - (uVar51 & 0xff)) {
                bVar12 = stbi__get8(s);
                iVar27 = stbi__at_eof(s);
                if (iVar27 != 0) {
                  pcVar29 = "file too short (pure read count)";
                  goto LAB_0013de77;
                }
                psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),(stbi_uc *)coutput
                                       );
                if (psVar32 == (stbi_uc *)0x0) goto LAB_0013de93;
                uVar51 = (uint)bVar12;
                if (uVar56 < bVar12) {
                  uVar51 = uVar56;
                }
                uVar54 = uVar51 & 0xff;
                while (bVar63 = uVar54 != 0, uVar54 = uVar54 - 1, bVar63) {
                  stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar53,(stbi_uc *)coutput);
                  psVar53 = psVar53 + 4;
                }
              }
            }
            else {
              if (cVar3 != '\x02') {
                pcVar29 = "packet has bad compression type";
LAB_0013de77:
                *(char **)(in_FS_OFFSET + -0x10) = pcVar29;
                goto LAB_0013de93;
              }
              for (; 0 < (int)uVar56; uVar56 = uVar56 - iVar27) {
                bVar12 = stbi__get8(s);
                iVar27 = stbi__at_eof(s);
                if (iVar27 != 0) {
                  pcVar29 = "file too short (mixed read count)";
                  goto LAB_0013de77;
                }
                uVar51 = (uint)bVar12;
                if ((char)bVar12 < '\0') {
                  if (uVar51 == 0x80) {
                    iVar27 = stbi__get16be(s);
                  }
                  else {
                    iVar27 = uVar51 - 0x7f;
                  }
                  if ((int)uVar56 < iVar27) goto LAB_0013e313;
                  psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),
                                          (stbi_uc *)coutput);
                  iVar50 = iVar27;
                  if (psVar32 == (stbi_uc *)0x0) goto LAB_0013de93;
                  while (iVar50 != 0) {
                    stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar53,(stbi_uc *)coutput
                                 );
                    psVar53 = psVar53 + 4;
                    iVar50 = iVar50 + -1;
                  }
                }
                else {
                  iVar27 = bVar12 + 1;
                  iVar50 = iVar27;
                  if (uVar56 <= uVar51) {
LAB_0013e313:
                    pcVar29 = "scanline overrun";
                    goto LAB_0013de77;
                  }
                  while (bVar63 = iVar50 != 0, iVar50 = iVar50 + -1, bVar63) {
                    psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar53);
                    if (psVar32 == (stbi_uc *)0x0) goto LAB_0013de93;
                    psVar53 = psVar53 + 4;
                  }
                }
              }
            }
          }
        }
        if (psVar28 == (stbi__jpeg *)0x0) {
LAB_0013de93:
          free(psVar28);
          psVar28 = (stbi__jpeg *)0x0;
        }
        *x = uVar60;
        *y = uVar41;
        bVar63 = req_comp != 0;
        if (bVar63) {
          iVar19 = req_comp;
        }
        req_comp = iVar19;
        if (!bVar63 && comp != (int *)0x0) {
          req_comp = *comp;
        }
        uVar59 = 4;
        goto LAB_0013deda;
      }
    }
    sVar14 = stbi__get8(s);
    sVar15 = stbi__get8(s);
    if ((sVar14 == 'P') && (0xfd < (byte)(sVar15 - 0x37))) {
      iVar19 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
      if (iVar19 == 0) {
        return (void *)0x0;
      }
      *x = s->img_x;
      sVar20 = s->img_y;
      *y = sVar20;
      iVar19 = s->img_n;
      if (comp != (int *)0x0) {
        *comp = iVar19;
        sVar20 = s->img_y;
      }
      sVar24 = s->img_x;
      iVar27 = stbi__mad3sizes_valid(iVar19,sVar24,sVar20,0);
      if (iVar27 == 0) {
        pcVar29 = "PNM too large";
        goto LAB_0013b3a2;
      }
      puVar31 = (uchar *)stbi__malloc_mad3(iVar19,sVar24,sVar20,0);
      if (puVar31 != (uchar *)0x0) {
        stbi__getn(s,puVar31,sVar20 * iVar19 * sVar24);
        if (req_comp == 0) {
          return puVar31;
        }
        iVar19 = s->img_n;
        if (iVar19 != req_comp) {
          puVar31 = stbi__convert_format(puVar31,iVar19,req_comp,s->img_x,s->img_y);
          return puVar31;
        }
        return puVar31;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar19 = stbi__hdr_test(s);
      if (iVar19 == 0) {
        stbi__get8(s);
        bVar12 = stbi__get8(s);
        if (bVar12 < 2) {
          bVar13 = stbi__get8(s);
          if (bVar12 == 1) {
            if ((bVar13 & 0xf7) == 1) {
              iVar19 = 4;
              stbi__skip(s,4);
              bVar13 = stbi__get8(s);
              if ((bVar13 < 0x21) && ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) != 0))
              goto LAB_0013d0cf;
            }
            goto LAB_0013cc75;
          }
          if ((bVar13 & 0xf6) != 2) goto LAB_0013cc75;
          iVar19 = 9;
LAB_0013d0cf:
          stbi__skip(s,iVar19);
          iVar19 = stbi__get16le(s);
          if ((iVar19 == 0) || (iVar19 = stbi__get16le(s), iVar19 == 0)) goto LAB_0013cc75;
          bVar13 = stbi__get8(s);
          if (bVar12 != 1) {
            if ((bVar13 < 0x21) && ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) != 0)) {
              s->img_buffer = s->img_buffer_original;
              s->img_buffer_end = s->img_buffer_original_end;
              goto LAB_0013ddbf;
            }
            goto LAB_0013cc75;
          }
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if ((bVar13 - 8 & 0xf7) == 0) {
LAB_0013ddbf:
            bVar13 = stbi__get8(s);
            sVar14 = stbi__get8(s);
            bVar16 = stbi__get8(s);
            iVar19 = stbi__get16le(s);
            uVar56 = stbi__get16le(s);
            bVar12 = stbi__get8(s);
            stbi__get16le(s);
            stbi__get16le(s);
            uVar60 = stbi__get16le(s);
            uVar41 = stbi__get16le(s);
            bVar17 = stbi__get8(s);
            data._0_8_ = (ulong)(uint)data._4_4_ << 0x20;
            bVar18 = stbi__get8(s);
            coutput[0] = (stbi_uc *)((ulong)coutput[0]._4_4_ << 0x20);
            if (sVar14 == '\0') {
              uVar59 = bVar16 - 8;
              if (bVar16 < 8) {
                uVar59 = (uint)bVar16;
              }
              uVar59 = (uint)(uVar59 == 3);
              bVar12 = bVar17;
            }
            else {
              uVar59 = 0;
            }
            uVar59 = stbi__tga_get_comp((uint)bVar12,uVar59,(int *)data);
            if (uVar59 == 0) {
              pcVar29 = "Can\'t find out TGA pixelformat";
              goto LAB_0013b3a2;
            }
            *x = uVar60;
            *y = uVar41;
            if (comp != (int *)0x0) {
              *comp = uVar59;
            }
            iVar27 = stbi__mad3sizes_valid(uVar60,uVar41,uVar59,0);
            if (iVar27 != 0) {
              psVar28 = (stbi__jpeg *)stbi__malloc_mad3(uVar60,uVar41,uVar59,0);
              if (psVar28 == (stbi__jpeg *)0x0) goto LAB_0013cdbe;
              stbi__skip(s,(uint)bVar13);
              uVar37 = (ulong)uVar59;
              if (((sVar14 == '\0') && (bVar16 < 8)) && (data._0_4_ == 0)) {
                uVar51 = 0;
                uVar56 = uVar41;
                while (uVar56 = uVar56 - 1, uVar56 != 0xffffffff) {
                  uVar54 = uVar51;
                  if ((bVar18 >> 5 & 1) == 0) {
                    uVar54 = uVar56;
                  }
                  stbi__getn(s,psVar28->huff_dc[0].fast + (long)(int)(uVar54 * uVar59 * uVar60) + -8
                             ,uVar59 * uVar60);
                  uVar51 = uVar51 + 1;
                }
              }
              else {
                if (sVar14 == '\0') {
                  local_8940 = (stbi_uc *)0x0;
                }
                else {
                  stbi__skip(s,iVar19);
                  local_8940 = (stbi_uc *)stbi__malloc_mad2(uVar56,uVar59,0);
                  if (local_8940 == (stbi_uc *)0x0) goto LAB_0013cdb9;
                  psVar36 = local_8940;
                  uVar51 = uVar56;
                  if (data._0_4_ == 0) {
                    iVar19 = stbi__getn(s,local_8940,uVar59 * uVar56);
                    if (iVar19 == 0) {
                      free(psVar28);
                      free(local_8940);
                      goto LAB_0013e61a;
                    }
                  }
                  else {
                    while (uVar51 != 0) {
                      stbi__tga_read_rgb16(s,psVar36);
                      psVar36 = psVar36 + uVar37;
                      uVar51 = uVar51 - 1;
                    }
                  }
                }
                bVar63 = true;
                iVar19 = 0;
                uVar51 = 0;
                psVar49 = psVar28;
                for (uVar52 = 0; uVar52 != uVar41 * uVar60; uVar52 = uVar52 + 1) {
                  if (bVar16 < 8) {
LAB_0013e43e:
                    if (sVar14 == '\0') {
                      if (data._0_4_ == 0) {
                        for (uVar47 = 0; uVar37 != uVar47; uVar47 = uVar47 + 1) {
                          sVar15 = stbi__get8(s);
                          *(stbi_uc *)((long)coutput + uVar47) = sVar15;
                        }
                      }
                      else {
                        stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                      }
                    }
                    else {
                      if (bVar17 == 8) {
                        bVar12 = stbi__get8(s);
                        uVar54 = (uint)bVar12;
                      }
                      else {
                        uVar54 = stbi__get16le(s);
                      }
                      if (uVar56 <= uVar54) {
                        uVar54 = 0;
                      }
                      for (uVar47 = 0; uVar37 != uVar47; uVar47 = uVar47 + 1) {
                        *(stbi_uc *)((long)coutput + uVar47) = local_8940[uVar47 + uVar54 * uVar59];
                      }
                    }
                  }
                  else {
                    if (iVar19 == 0) {
                      bVar12 = stbi__get8(s);
                      iVar19 = (bVar12 & 0x7f) + 1;
                      uVar51 = (uint)(bVar12 >> 7);
                      goto LAB_0013e43e;
                    }
                    if (uVar51 == 0 || bVar63) {
                      uVar51 = (uint)(uVar51 != 0);
                      goto LAB_0013e43e;
                    }
                    uVar51 = 1;
                  }
                  for (uVar47 = 0; uVar37 != uVar47; uVar47 = uVar47 + 1) {
                    psVar49->huff_dc[0].fast[uVar47 - 8] = *(stbi_uc *)((long)coutput + uVar47);
                  }
                  iVar19 = iVar19 + -1;
                  psVar49 = (stbi__jpeg *)(psVar49->huff_dc[0].fast + (uVar37 - 8));
                  bVar63 = false;
                }
                if ((bVar18 >> 5 & 1) == 0) {
                  iVar19 = uVar59 * uVar60;
                  iVar27 = (uVar41 - 1) * iVar19;
                  uVar56 = 0;
                  for (uVar51 = 0; uVar51 != uVar41 + 1 >> 1; uVar51 = uVar51 + 1) {
                    psVar49 = psVar28;
                    for (iVar50 = iVar19; 0 < iVar50; iVar50 = iVar50 + -1) {
                      sVar14 = psVar49->huff_dc[0].fast[(ulong)uVar56 - 8];
                      psVar49->huff_dc[0].fast[(ulong)uVar56 - 8] =
                           psVar49->huff_dc[0].fast[(long)iVar27 + -8];
                      psVar49->huff_dc[0].fast[(long)iVar27 + -8] = sVar14;
                      psVar49 = (stbi__jpeg *)((long)&psVar49->s + 1);
                    }
                    uVar56 = uVar56 + iVar19;
                    iVar27 = iVar27 - iVar19;
                  }
                }
                free(local_8940);
              }
              if ((2 < uVar59) && (data._0_4_ == 0)) {
                iVar19 = uVar41 * uVar60;
                puVar39 = (undefined1 *)((long)&psVar28->s + 2);
                while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
                  uVar5 = puVar39[-2];
                  puVar39[-2] = *puVar39;
                  *puVar39 = uVar5;
                  puVar39 = puVar39 + uVar37;
                }
              }
              if (req_comp == 0) {
                return psVar28;
              }
              if (uVar59 == req_comp) {
                return psVar28;
              }
LAB_0013deda:
              puVar31 = stbi__convert_format((uchar *)psVar28,uVar59,req_comp,uVar60,uVar41);
              return puVar31;
            }
LAB_0013e61a:
            pcVar29 = "Corrupt TGA";
            goto LAB_0013b3a2;
          }
        }
        else {
LAB_0013cc75:
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        pcVar29 = "Image not of any known type, or corrupt";
        goto LAB_0013b3a2;
      }
      psVar28 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      if (psVar28 == (stbi__jpeg *)0x0) {
        return (void *)0x0;
      }
      iVar19 = *x;
      iVar27 = *y;
      data_00 = (stbi__context *)stbi__malloc_mad3(iVar19,iVar27,req_comp,0);
      if (data_00 != (stbi__context *)0x0) {
        uVar41 = (req_comp + (req_comp & 1U)) - 1;
        uVar60 = iVar27 * iVar19;
        uVar37 = (ulong)uVar41;
        if ((int)uVar41 < 1) {
          uVar37 = 0;
        }
        lVar30 = (long)req_comp;
        uVar52 = (ulong)uVar60;
        if ((int)uVar60 < 1) {
          uVar52 = 0;
        }
        psVar43 = data_00;
        psVar49 = psVar28;
        for (uVar47 = 0; uVar47 != uVar52; uVar47 = uVar47 + 1) {
          for (uVar42 = 0; uVar37 != uVar42; uVar42 = uVar42 + 1) {
            fVar64 = powf(*(float *)(psVar49->huff_dc[0].fast + uVar42 * 4 + -8) * stbi__h2l_scale_i
                          ,stbi__h2l_gamma_i);
            fVar65 = fVar64 * 255.0 + 0.5;
            fVar64 = 0.0;
            if (0.0 <= fVar65) {
              fVar64 = fVar65;
            }
            fVar65 = 255.0;
            if (fVar64 <= 255.0) {
              fVar65 = fVar64;
            }
            psVar43->buffer_start[uVar42 - 0x38] = (stbi_uc)(int)fVar65;
          }
          if ((int)uVar37 < req_comp) {
            lVar46 = uVar47 * lVar30 + uVar37;
            fVar65 = *(float *)(psVar28->huff_dc[0].fast + lVar46 * 4 + -8) * 255.0 + 0.5;
            fVar64 = 0.0;
            if (0.0 <= fVar65) {
              fVar64 = fVar65;
            }
            fVar65 = 255.0;
            if (fVar64 <= 255.0) {
              fVar65 = fVar64;
            }
            data_00->buffer_start[lVar46 + -0x38] = (stbi_uc)(int)fVar65;
          }
          psVar43 = (stbi__context *)(psVar43->buffer_start + lVar30 + -0x38);
          psVar49 = (stbi__jpeg *)(psVar49->huff_dc[0].fast + lVar30 * 4 + -8);
        }
        goto LAB_0013c05d;
      }
LAB_0013cdb9:
      free(psVar28);
    }
  }
LAB_0013cdbe:
  pcVar29 = "Out of memory";
LAB_0013b3a2:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar29;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}